

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O1

void __thiscall solution::clear(solution *this)

{
  pointer pbVar1;
  pointer pbVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  vector<bucket,_std::allocator<bucket>_> *__range1;
  undefined4 uVar9;
  undefined4 uVar12;
  int iVar13;
  undefined1 auVar11 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar10 [16];
  
  auVar5 = _DAT_00107530;
  auVar4 = _DAT_00107520;
  auVar3 = _DAT_00107510;
  pbVar1 = (this->buckets).super__Vector_base<bucket,_std::allocator<bucket>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar2 = (this->buckets).super__Vector_base<bucket,_std::allocator<bucket>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    uVar6 = (long)pbVar2 + (-0x28 - (long)pbVar1);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar6;
    uVar9 = SUB164(auVar15 * ZEXT816(0xcccccccccccccccd),8);
    uVar12 = (undefined4)(uVar6 / 0x140000000);
    auVar10._0_8_ = CONCAT44(uVar12,uVar9);
    auVar10._8_4_ = uVar9;
    auVar10._12_4_ = uVar12;
    auVar11._0_8_ = auVar10._0_8_ >> 5;
    auVar11._8_8_ = auVar10._8_8_ >> 5;
    piVar8 = &pbVar1[3].used;
    uVar7 = 0;
    auVar11 = auVar11 ^ _DAT_00107530;
    do {
      auVar14._8_4_ = (int)uVar7;
      auVar14._0_8_ = uVar7;
      auVar14._12_4_ = (int)(uVar7 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar11._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar11._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        piVar8[-0x1e] = 0;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        piVar8[-0x14] = 0;
      }
      auVar15 = (auVar14 | auVar3) ^ auVar5;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar15._0_4_ <= auVar11._0_4_)) {
        piVar8[-10] = 0;
        *piVar8 = 0;
      }
      uVar7 = uVar7 + 4;
      piVar8 = piVar8 + 0x28;
    } while ((uVar6 / 0x28 + 4 & 0xfffffffffffffffc) != uVar7);
  }
  std::deque<step,_std::allocator<step>_>::clear(&this->current_steps);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(&this->steps_ixes);
  this->not_found_reason = (char *)0x0;
  this->measure = 0;
  this->wastage = 0;
  return;
}

Assistant:

void solution::clear()
{
	for (bucket& b : buckets)
		b.used = 0;
	current_steps.clear();
	steps_ixes.clear();
	not_found_reason = nullptr;
	measure = 0;
	wastage = 0;
}